

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

ggml_threadpool_params * ggml_threadpool_params_from_cpu_params(cpu_params *params)

{
  undefined4 *in_RSI;
  ggml_threadpool_params *in_RDI;
  
  ggml_threadpool_params_init(in_RDI,*in_RSI);
  if ((*(byte *)(in_RSI + 0x81) & 1) != 0) {
    memcpy(in_RDI,in_RSI + 1,0x200);
  }
  in_RDI->prio = in_RSI[0x82];
  in_RDI->poll = in_RSI[0x84];
  in_RDI->strict_cpu = (bool)(*(byte *)(in_RSI + 0x83) & 1);
  return in_RDI;
}

Assistant:

struct ggml_threadpool_params ggml_threadpool_params_from_cpu_params(const cpu_params & params) {
    struct ggml_threadpool_params tpp;

    ggml_threadpool_params_init(&tpp, params.n_threads); // setup the defaults

    if (params.mask_valid) {
        std::memcpy(&tpp.cpumask, &params.cpumask, GGML_MAX_N_THREADS);
    }

    tpp.prio       = params.priority;
    tpp.poll       = params.poll;
    tpp.strict_cpu = params.strict_cpu;

    return tpp;
}